

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O1

QString * __thiscall
QStringBuilder<QStringBuilder<QStringBuilder<char16_t,_QString_&>,_QLatin1String>,_const_QString_&>
::convertTo<QString>
          (QString *__return_storage_ptr__,
          QStringBuilder<QStringBuilder<QStringBuilder<char16_t,_QString_&>,_QLatin1String>,_const_QString_&>
          *this)

{
  QLatin1String *pQVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  QString *pQVar5;
  char16_t *pcVar6;
  char16_t *pcVar7;
  
  lVar2 = (((this->a).a.b)->d).size;
  lVar3 = (this->a).b.m_size;
  lVar4 = (this->b->d).size;
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QString::QString(__return_storage_ptr__,lVar4 + lVar2 + lVar3 + 1,Uninitialized);
  pcVar7 = (__return_storage_ptr__->d).ptr;
  *pcVar7 = (this->a).a.a;
  pcVar7 = pcVar7 + 1;
  pQVar5 = (this->a).a.b;
  lVar2 = (pQVar5->d).size;
  if (lVar2 != 0) {
    pcVar6 = (pQVar5->d).ptr;
    if (pcVar6 == (char16_t *)0x0) {
      pcVar6 = (char16_t *)&QString::_empty;
    }
    memcpy(pcVar7,pcVar6,lVar2 * 2);
  }
  pQVar1 = &(this->a).b;
  lVar3 = pQVar1->m_size;
  QAbstractConcatenable::appendLatin1To(*pQVar1,(QChar *)(pcVar7 + lVar2));
  lVar4 = (this->b->d).size;
  if (lVar4 != 0) {
    pcVar6 = (this->b->d).ptr;
    if (pcVar6 == (char16_t *)0x0) {
      pcVar6 = (char16_t *)&QString::_empty;
    }
    memcpy((QChar *)(pcVar7 + lVar2) + lVar3,pcVar6,lVar4 * 2);
  }
  return __return_storage_ptr__;
}

Assistant:

T convertTo() const
    {
        if (isNull()) {
            // appending two null strings must give back a null string,
            // so we're special casing this one out, QTBUG-114206
            return T();
        }

        const qsizetype len = Concatenable::size(*this);
        T s(len, Qt::Uninitialized);

        // Using data_ptr() here (private API) so we can bypass the
        // isDetached() and the replacement of a null pointer with _empty in
        // both QString and QByteArray's data() and constData(). The result is
        // the same if len != 0.
        auto d = reinterpret_cast<typename T::iterator>(s.data_ptr().data());
        const auto start = d;
        Concatenable::appendTo(*this, d);

        if constexpr (Concatenable::ExactSize) {
            Q_UNUSED(start)
        } else {
            if (len != d - start) {
                // this resize is necessary since we allocate a bit too much
                // when dealing with variable sized 8-bit encodings
                s.resize(d - start);
            }
        }
        return s;
    }